

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStorage.cpp
# Opt level: O0

void __thiscall OpenMD::DataStorage::resize(DataStorage *this,size_t newSize)

{
  undefined8 in_RSI;
  long in_RDI;
  size_t in_stack_00000050;
  vector<double,_std::allocator<double>_> *in_stack_00000058;
  DataStorage *in_stack_00000060;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_stack_00000068;
  DataStorage *in_stack_00000070;
  size_t in_stack_000000b0;
  vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
  *in_stack_000000b8;
  DataStorage *in_stack_000000c0;
  
  if ((*(uint *)(in_RDI + 0x1b8) & 1) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 2) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 4) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 8) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>
              (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x10) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x20) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x40) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x80) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x100) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x200) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x400) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x800) != 0) {
    internalResize<OpenMD::SquareMatrix3<double>>
              (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x1000) != 0) {
    internalResize<OpenMD::Vector3<double>>
              (in_stack_00000070,in_stack_00000068,(size_t)in_stack_00000060);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x2000) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x4000) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x8000) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x10000) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  if ((*(uint *)(in_RDI + 0x1b8) & 0x20000) != 0) {
    internalResize<double>(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  }
  *(undefined8 *)(in_RDI + 0x1b0) = in_RSI;
  return;
}

Assistant:

void DataStorage::resize(std::size_t newSize) {
    if (storageLayout_ & dslPosition) { internalResize(position, newSize); }

    if (storageLayout_ & dslVelocity) { internalResize(velocity, newSize); }

    if (storageLayout_ & dslForce) { internalResize(force, newSize); }

    if (storageLayout_ & dslAmat) { internalResize(aMat, newSize); }

    if (storageLayout_ & dslAngularMomentum) {
      internalResize(angularMomentum, newSize);
    }

    if (storageLayout_ & dslTorque) { internalResize(torque, newSize); }

    if (storageLayout_ & dslParticlePot) {
      internalResize(particlePot, newSize);
    }

    if (storageLayout_ & dslDensity) { internalResize(density, newSize); }

    if (storageLayout_ & dslFunctional) { internalResize(functional, newSize); }

    if (storageLayout_ & dslFunctionalDerivative) {
      internalResize(functionalDerivative, newSize);
    }

    if (storageLayout_ & dslDipole) { internalResize(dipole, newSize); }

    if (storageLayout_ & dslQuadrupole) { internalResize(quadrupole, newSize); }

    if (storageLayout_ & dslElectricField) {
      internalResize(electricField, newSize);
    }

    if (storageLayout_ & dslSkippedCharge) {
      internalResize(skippedCharge, newSize);
    }

    if (storageLayout_ & dslFlucQPosition) {
      internalResize(flucQPos, newSize);
    }

    if (storageLayout_ & dslFlucQVelocity) {
      internalResize(flucQVel, newSize);
    }

    if (storageLayout_ & dslFlucQForce) { internalResize(flucQFrc, newSize); }

    if (storageLayout_ & dslSitePotential) {
      internalResize(sitePotential, newSize);
    }

    size_ = newSize;
  }